

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<vertex_t,_vertex_t>::Resize(TArray<vertex_t,_vertex_t> *this,uint amount)

{
  undefined8 *puVar1;
  vertex_t *pvVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = amount - this->Count;
  if (this->Count <= amount && uVar5 != 0) {
    Grow(this,uVar5);
    uVar5 = this->Count;
    if (uVar5 < amount) {
      lVar4 = (ulong)uVar5 * 0x38 + 0x28;
      lVar3 = (ulong)amount - (ulong)uVar5;
      do {
        pvVar2 = this->Array;
        *(undefined8 *)((long)pvVar2 + lVar4 + -0x18) = 0;
        puVar1 = (undefined8 *)((long)pvVar2 + lVar4 + -0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)pvVar2 + lVar4 + -0x10) = 1;
        *(undefined8 *)((long)pvVar2 + lVar4 + -0xc) = 0;
        puVar1 = (undefined8 *)((long)&(pvVar2->p).X + lVar4);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar4 = lVar4 + 0x38;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}